

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseStructBody(Parser *this,Structure *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view memberName;
  Type type;
  string name;
  CodeLocation typeLocation;
  Type structType;
  Category CVar2;
  undefined4 in_stack_fffffffffffffe88;
  PrimitiveType in_stack_fffffffffffffe8c;
  StructurePtr local_168;
  Structure *local_160;
  string local_158;
  CodeLocation local_138;
  string local_128;
  Type local_108;
  Type local_f0;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x26223a);
  if (!bVar1) {
    do {
      local_138.sourceCode.object =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.sourceCode.object;
      if (local_138.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_138.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_138.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_138.location.data =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      readValueType((Type *)&stack0xfffffffffffffe88,this);
      readGeneralIdentifier_abi_cxx11_(&local_158,this);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x261d5f);
      memberName._M_str = local_158._M_dataplus._M_p;
      memberName._M_len = local_158._M_string_length;
      bVar1 = Structure::hasMemberWithName(s,memberName);
      if (bVar1) {
        CompileMessageHelpers::createMessage<std::__cxx11::string&>
                  (&local_d8,(CompileMessageHelpers *)0x1,none,0x284f23,(char *)&local_158,in_R9);
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_d8);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d8.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_d8.description._M_dataplus._M_p._1_7_,
                        local_d8.description._M_dataplus._M_p._0_1_) !=
            &local_d8.description.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_d8.description._M_dataplus._M_p._1_7_,
                                   local_d8.description._M_dataplus._M_p._0_1_),
                          (ulong)(local_d8.description.field_2._M_allocated_capacity + 1));
        }
      }
      local_d8.description._M_dataplus._M_p._0_1_ = 6;
      local_d8.description._M_string_length._1_7_ = 0;
      local_d8.description._M_dataplus._M_p._1_7_ = 0;
      local_d8.description._M_string_length._0_1_ = 0;
      (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
      local_d8.description.field_2._M_allocated_capacity = (size_type)s;
      bVar1 = Type::isEqual((Type *)&stack0xfffffffffffffe88,(Type *)&local_d8,0);
      if (bVar1) {
        CompileMessageHelpers::createMessage<std::__cxx11::string_const&>
                  (&local_68,(CompileMessageHelpers *)0x1,none,0x263002,(char *)&s->name,in_R9);
        CodeLocation::throwError(&local_138,&local_68);
      }
      CVar2 = (Category)in_stack_fffffffffffffe88;
      if (CVar2 == structure) {
        local_160 = local_168.object;
        if (local_168.object == (Structure *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x47);
        }
        ((local_168.object)->super_RefCountedObject).refCount =
             ((local_168.object)->super_RefCountedObject).refCount + 1;
        local_f0.category = structure;
        local_f0._9_7_ = 0;
        local_f0.arrayElementCategory = invalid;
        local_f0.isRef = false;
        local_f0.isConstant = false;
        local_f0.primitiveType.type = invalid;
        local_f0.boundingSize._0_1_ = 0;
        (s->super_RefCountedObject).refCount = (s->super_RefCountedObject).refCount + 1;
        local_f0.structure.object = s;
        bVar1 = Structure::containsMemberOfType(local_168.object,&local_f0,true);
      }
      else {
        bVar1 = false;
      }
      if (CVar2 == structure) {
        RefCountedPtr<soul::Structure>::decIfNotNull(local_f0.structure.object);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_160);
      }
      if (bVar1 != false) {
        if ((Category)in_stack_fffffffffffffe88 != structure) {
          throwInternalCompilerError("isStruct()","getStruct",0x188);
        }
        if (local_168.object == (Structure *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x47);
        }
        ((local_168.object)->super_RefCountedObject).refCount =
             ((local_168.object)->super_RefCountedObject).refCount + 1;
        CompileMessageHelpers::
        createMessage<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (&local_a0,(CompileMessageHelpers *)0x1,none,0x263035,(char *)&s->name,
                   &(local_168.object)->name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe8c.type,in_stack_fffffffffffffe88));
        CodeLocation::throwError(&local_138,&local_a0);
      }
      local_108.structure.object = local_168.object;
      if (local_168.object != (Structure *)0x0) {
        ((local_168.object)->super_RefCountedObject).refCount =
             ((local_168.object)->super_RefCountedObject).refCount + 1;
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      Structure::addMember(s,&local_108,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_108.structure.object);
      RefCountedPtr<soul::Structure>::decIfNotNull
                ((Structure *)local_d8.description.field_2._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_168.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_138.sourceCode.object);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x26223a);
    } while (!bVar1);
  }
  return;
}

Assistant:

void parseStructBody (Structure& s)
    {
        while (! matchIf (HEARTOperator::closeBrace))
        {
            auto typeLocation = location;

            auto type = readValueType();
            auto name = readGeneralIdentifier();
            expectSemicolon();

            if (s.hasMemberWithName (name))
                throwError (Errors::nameInUse (name));

            auto structType = Type::createStruct (s);

            if (type.isEqual (structType, Type::failOnAllDifferences))
                typeLocation.throwError (Errors::typeContainsItself (s.getName()));

            if (type.isStruct() && type.getStruct()->containsMemberOfType (Type::createStruct (s), true))
                typeLocation.throwError (Errors::typesReferToEachOther (s.getName(), type.getStruct()->getName()));

            s.addMember (type, name);
        }
    }